

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O3

void __thiscall
CoreML::Specification::LinearQuantizationParams::_internal_add_bias
          (LinearQuantizationParams *this,float value)

{
  RepeatedField<float> *this_00;
  uint uVar1;
  float *pfVar2;
  
  this_00 = &this->bias_;
  uVar1 = (this->bias_).current_size_;
  if (uVar1 == (this->bias_).total_size_) {
    google::protobuf::RepeatedField<float>::Reserve(this_00,uVar1 + 1);
    pfVar2 = google::protobuf::RepeatedField<float>::elements(this_00);
    pfVar2[uVar1] = value;
  }
  else {
    pfVar2 = google::protobuf::RepeatedField<float>::elements(this_00);
    pfVar2[uVar1] = value;
  }
  this_00->current_size_ = uVar1 + 1;
  return;
}

Assistant:

inline void LinearQuantizationParams::_internal_add_bias(float value) {
  bias_.Add(value);
}